

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

void __thiscall QFileSystemModelPrivate::~QFileSystemModelPrivate(QFileSystemModelPrivate *this)

{
  QFileInfoGatherer *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  QDeadlineTimer QVar3;
  QDeadlineTimer local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR__QFileSystemModelPrivate_007e2768;
  QFileInfoGatherer::requestAbort
            ((QFileInfoGatherer *)
             (this->fileInfoGatherer)._M_t.
             super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
             super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
             super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl);
  pQVar1 = (this->fileInfoGatherer)._M_t.
           super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
           super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
           super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl;
  QDeadlineTimer::QDeadlineTimer(&local_30,1000,CoarseTimer);
  QVar3.t2 = (undefined4)local_30.t1;
  QVar3.type = local_30.t1._4_4_;
  QVar3.t1 = (qint64)pQVar1;
  cVar2 = QThread::wait(QVar3);
  if (cVar2 == '\0') {
    (this->fileInfoGatherer)._M_t.
    super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
    super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
    super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl = (QFileInfoGatherer *)0x0;
    QObject::deleteLater();
  }
  if ((this->fetchingTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  QArrayDataPointer<QFileSystemModelPrivate::Fetching>::~QArrayDataPointer(&(this->toFetch).d);
  QFileSystemNode::~QFileSystemNode(&this->root);
  QHash<QString,_QString>::~QHash(&this->resolvedSymLinks);
  std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::~vector
            (&this->nameFiltersRegexps);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->nameFilters).d);
  QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::~QHash(&this->bypassFilters);
  QTimer::~QTimer(&this->delayedSortTimer);
  pQVar1 = (this->fileInfoGatherer)._M_t.
           super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
           super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
           super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl;
  if (pQVar1 != (QFileInfoGatherer *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x20))();
  }
  (this->fileInfoGatherer)._M_t.
  super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
  super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
  super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl = (QFileInfoGatherer *)0x0;
  QDir::~QDir(&this->rootDir);
  QAbstractItemModelPrivate::~QAbstractItemModelPrivate(&this->super_QAbstractItemModelPrivate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemModelPrivate::~QFileSystemModelPrivate()
{
#if QT_CONFIG(filesystemwatcher)
    fileInfoGatherer->requestAbort();
    if (!fileInfoGatherer->wait(1000)) {
        // If the thread hangs, perhaps because the network was disconnected
        // while the gatherer was stat'ing a remote file, then don't block
        // shutting down the model (which might block a file dialog and the
        // main thread). Schedule the gatherer for later deletion; it's
        // destructor will wait for the thread to finish.
        auto *rawGatherer = fileInfoGatherer.release();
        rawGatherer->deleteLater();
    }
#endif // filesystemwatcher
}